

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

Gia_Man_t * Gia_ManBuildGig2(Vec_Int_t *vObjs,Vec_Int_t *vStore,char *pFileName)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *p_02;
  char *pcVar3;
  Gia_Man_t *pGVar4;
  int local_4c;
  int Type;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vTypes;
  Vec_Int_t *vNets;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  char *pFileName_local;
  Vec_Int_t *vStore_local;
  Vec_Int_t *vObjs_local;
  
  iVar1 = Vec_IntSize(vObjs);
  p = Vec_IntAlloc(iVar1);
  iVar1 = Vec_IntSize(vObjs);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_4c = 0; iVar1 = Vec_IntSize(vObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(vObjs,local_4c);
    iVar1 = Vec_IntEntry(vStore,iVar1);
    Vec_IntPush(p,iVar1);
    iVar1 = Vec_IntEntry(vObjs,local_4c);
    iVar1 = Vec_IntEntry(vStore,iVar1 + 1);
    Vec_IntPush(p_00,iVar1);
  }
  iVar1 = Vec_IntFindMax(p);
  p_01 = Vec_IntStartFull(iVar1 + 1);
  Vec_IntWriteEntry(p_01,0,0);
  Vec_IntWriteEntry(p_01,1,1);
  iVar1 = Vec_IntSize(vObjs);
  p_02 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(pFileName);
  p_02->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pFileName);
  p_02->pSpec = pcVar3;
  for (local_4c = 0; iVar1 = Vec_IntSize(vObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(p_00,local_4c);
    if (iVar1 == 2) {
      iVar1 = Vec_IntEntry(p,local_4c);
      iVar2 = Gia_ManAppendCi(p_02);
      Vec_IntWriteEntry(p_01,iVar1,iVar2);
    }
  }
  for (local_4c = 0; iVar1 = Vec_IntSize(vObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(p_00,local_4c);
    if (iVar1 == 7) {
      iVar1 = Vec_IntEntry(p,local_4c);
      iVar2 = Gia_ManAppendCi(p_02);
      Vec_IntWriteEntry(p_01,iVar1,iVar2);
    }
  }
  Gia_ManHashAlloc(p_02);
  for (local_4c = 0; iVar1 = Vec_IntSize(vObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    Vec_IntEntry(p_00,local_4c);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  pGVar4 = Gia_ManCleanup(p_02);
  Gia_ManStop(p_02);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManBuildGig2( Vec_Int_t * vObjs, Vec_Int_t * vStore, char * pFileName )
{
    Gia_Man_t * pNew, * pTemp;
    //int * nObjs = Gia_ManGigCount( vObjs, vStore );
    Vec_Int_t * vNets = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vTypes = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vMap;
    int i, Type;
    // connect net IDs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Vec_IntPush( vNets, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i)) );
        Vec_IntPush( vTypes, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1) );
    }
    // create mapping for net IDs into GIA IDs
    vMap = Vec_IntStartFull( Vec_IntFindMax(vNets) + 1 ); 
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create new manager
    pNew = Gia_ManStart( Vec_IntSize(vObjs) );
    pNew->pName = Abc_UtilStrsav( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    // create primary inputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_PI )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create box outputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_BOX )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create internal nodes
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Type = Vec_IntEntry(vTypes, i);
        if ( Type != GIG_LUT && Type != GIG_DELAY && Type != GIG_BAR )
            continue;

    }
    Vec_IntFree( vMap );
    Vec_IntFree( vNets );
    Vec_IntFree( vTypes );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}